

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBSubtractRow_C(uint8 *src_argb0,uint8 *src_argb1,uint8 *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  uint8 uVar9;
  
  if (0 < width) {
    lVar8 = 0;
    do {
      bVar1 = src_argb0[lVar8 * 4 + 1];
      bVar2 = src_argb0[lVar8 * 4 + 2];
      bVar3 = src_argb0[lVar8 * 4 + 3];
      bVar4 = src_argb1[lVar8 * 4 + 1];
      bVar5 = src_argb1[lVar8 * 4 + 2];
      bVar6 = src_argb1[lVar8 * 4 + 3];
      uVar9 = (uint8)((uint)src_argb0[lVar8 * 4] - (uint)src_argb1[lVar8 * 4]);
      if ((int)((uint)src_argb0[lVar8 * 4] - (uint)src_argb1[lVar8 * 4]) < 1) {
        uVar9 = '\0';
      }
      dst_argb[lVar8 * 4] = uVar9;
      uVar9 = (uint8)((uint)bVar1 - (uint)bVar4);
      if ((int)((uint)bVar1 - (uint)bVar4) < 1) {
        uVar9 = '\0';
      }
      dst_argb[lVar8 * 4 + 1] = uVar9;
      iVar7 = (uint)bVar2 - (uint)bVar5;
      if ((int)((uint)bVar2 - (uint)bVar5) < 1) {
        iVar7 = 0;
      }
      uVar9 = (uint8)((uint)bVar3 - (uint)bVar6);
      if ((int)((uint)bVar3 - (uint)bVar6) < 1) {
        uVar9 = '\0';
      }
      dst_argb[lVar8 * 4 + 2] = (uint8)iVar7;
      dst_argb[lVar8 * 4 + 3] = uVar9;
      lVar8 = lVar8 + 1;
    } while (width != (int)lVar8);
  }
  return;
}

Assistant:

void ARGBSubtractRow_C(const uint8* src_argb0,
                       const uint8* src_argb1,
                       uint8* dst_argb,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const int b = src_argb0[0];
    const int g = src_argb0[1];
    const int r = src_argb0[2];
    const int a = src_argb0[3];
    const int b_sub = src_argb1[0];
    const int g_sub = src_argb1[1];
    const int r_sub = src_argb1[2];
    const int a_sub = src_argb1[3];
    dst_argb[0] = SHADE(b, b_sub);
    dst_argb[1] = SHADE(g, g_sub);
    dst_argb[2] = SHADE(r, r_sub);
    dst_argb[3] = SHADE(a, a_sub);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}